

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::XML_CheckNode_SkipUnsupported(X3DImporter *this,string *pParentNodeName)

{
  int iVar1;
  undefined4 extraout_var;
  Logger *this_00;
  runtime_error *this_01;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  bool bVar5;
  X3DImporter *this_02;
  long lVar6;
  string nn;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Alloc_hider local_50;
  
  local_b8 = pParentNodeName;
  iVar1 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb0,(char *)CONCAT44(extraout_var,iVar1),
             (allocator *)&local_d8);
  lVar6 = 0;
  bVar5 = false;
  while( true ) {
    lVar6 = lVar6 + 1;
    while (this_02 = (X3DImporter *)&stack0xffffffffffffffb0,
          iVar1 = std::__cxx11::string::compare((char *)&stack0xffffffffffffffb0), iVar1 != 0) {
      lVar6 = lVar6 + 1;
      if (lVar6 == 0xc1) {
        if (!bVar5) goto LAB_0061c4d7;
        goto LAB_0061c4ca;
      }
    }
    iVar1 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar1 != '\0') break;
    while( true ) {
      this_02 = (X3DImporter *)
                (this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar1 = (*(this_02->super_BaseImporter)._vptr_BaseImporter[2])();
      if ((char)iVar1 == '\0') break;
      iVar1 = (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
      if (iVar1 == 2) {
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar1 = std::__cxx11::string::compare((char *)&stack0xffffffffffffffb0);
        if (iVar1 == 0) goto LAB_0061c32a;
      }
    }
    bVar5 = true;
    if (lVar6 == 0xc0) {
LAB_0061c4ca:
      Throw_CloseNotFound(this_02,(string *)&stack0xffffffffffffffb0);
LAB_0061c4d7:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_70,"Unknown node \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b0._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
        local_b0.field_2._M_allocated_capacity = *psVar3;
        local_b0.field_2._8_8_ = plVar2[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar3;
      }
      local_b0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_90,&local_b0,local_b8);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d8 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_d8 == plVar4) {
        local_c8 = *plVar4;
        lStack_c0 = plVar2[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar4;
      }
      local_d0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_01,(string *)&local_d8);
      *(undefined ***)this_01 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_0061c32a:
  std::operator+(&local_70,"Skipping node \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(local_b8->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c8 = *plVar4;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar4;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  this_00 = DefaultLogger::get();
  Logger::info(this_00,(char *)local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50._M_p != &stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void X3DImporter::XML_CheckNode_SkipUnsupported(const std::string& pParentNodeName)
{
    static const size_t Uns_Skip_Len = 192;
    const char* Uns_Skip[ Uns_Skip_Len ] = {
	    // CAD geometry component
	    "CADAssembly", "CADFace", "CADLayer", "CADPart", "IndexedQuadSet", "QuadSet",
	    // Core
	    "ROUTE", "ExternProtoDeclare", "ProtoDeclare", "ProtoInstance", "ProtoInterface", "WorldInfo",
	    // Distributed interactive simulation (DIS) component
	    "DISEntityManager", "DISEntityTypeMapping", "EspduTransform", "ReceiverPdu", "SignalPdu", "TransmitterPdu",
	    // Cube map environmental texturing component
	    "ComposedCubeMapTexture", "GeneratedCubeMapTexture", "ImageCubeMapTexture",
	    // Environmental effects component
	    "Background", "Fog", "FogCoordinate", "LocalFog", "TextureBackground",
	    // Environmental sensor component
	    "ProximitySensor", "TransformSensor", "VisibilitySensor",
	    // Followers component
	    "ColorChaser", "ColorDamper", "CoordinateChaser", "CoordinateDamper", "OrientationChaser", "OrientationDamper", "PositionChaser", "PositionChaser2D",
	    "PositionDamper", "PositionDamper2D", "ScalarChaser", "ScalarDamper", "TexCoordChaser2D", "TexCoordDamper2D",
	    // Geospatial component
	    "GeoCoordinate", "GeoElevationGrid", "GeoLocation", "GeoLOD", "GeoMetadata", "GeoOrigin", "GeoPositionInterpolator", "GeoProximitySensor",
	    "GeoTouchSensor", "GeoTransform", "GeoViewpoint",
	    // Humanoid Animation (H-Anim) component
	    "HAnimDisplacer", "HAnimHumanoid", "HAnimJoint", "HAnimSegment", "HAnimSite",
	    // Interpolation component
	    "ColorInterpolator", "CoordinateInterpolator", "CoordinateInterpolator2D", "EaseInEaseOut", "NormalInterpolator", "OrientationInterpolator",
	    "PositionInterpolator", "PositionInterpolator2D", "ScalarInterpolator", "SplinePositionInterpolator", "SplinePositionInterpolator2D",
	    "SplineScalarInterpolator", "SquadOrientationInterpolator",
	    // Key device sensor component
	    "KeySensor", "StringSensor",
	    // Layering component
	    "Layer", "LayerSet", "Viewport",
	    // Layout component
	    "Layout", "LayoutGroup", "LayoutLayer", "ScreenFontStyle", "ScreenGroup",
	    // Navigation component
	    "Billboard", "Collision", "LOD", "NavigationInfo", "OrthoViewpoint", "Viewpoint", "ViewpointGroup",
	    // Networking component
	    "EXPORT", "IMPORT", "Anchor", "LoadSensor",
	    // NURBS component
	    "Contour2D", "ContourPolyline2D", "CoordinateDouble", "NurbsCurve", "NurbsCurve2D", "NurbsOrientationInterpolator", "NurbsPatchSurface",
	    "NurbsPositionInterpolator", "NurbsSet", "NurbsSurfaceInterpolator", "NurbsSweptSurface", "NurbsSwungSurface", "NurbsTextureCoordinate",
	    "NurbsTrimmedSurface",
	    // Particle systems component
	    "BoundedPhysicsModel", "ConeEmitter", "ExplosionEmitter", "ForcePhysicsModel", "ParticleSystem", "PointEmitter", "PolylineEmitter", "SurfaceEmitter",
	    "VolumeEmitter", "WindPhysicsModel",
	    // Picking component
	    "LinePickSensor", "PickableGroup", "PointPickSensor", "PrimitivePickSensor", "VolumePickSensor",
	    // Pointing device sensor component
	    "CylinderSensor", "PlaneSensor", "SphereSensor", "TouchSensor",
	    // Rendering component
	    "ClipPlane",
	    // Rigid body physics
	    "BallJoint", "CollidableOffset", "CollidableShape", "CollisionCollection", "CollisionSensor", "CollisionSpace", "Contact", "DoubleAxisHingeJoint",
	    "MotorJoint", "RigidBody", "RigidBodyCollection", "SingleAxisHingeJoint", "SliderJoint", "UniversalJoint",
	    // Scripting component
	    "Script",
	    // Programmable shaders component
	    "ComposedShader", "FloatVertexAttribute", "Matrix3VertexAttribute", "Matrix4VertexAttribute", "PackagedShader", "ProgramShader", "ShaderPart",
	    "ShaderProgram",
	    // Shape component
	    "FillProperties", "LineProperties", "TwoSidedMaterial",
	    // Sound component
	    "AudioClip", "Sound",
	    // Text component
	    "FontStyle", "Text",
	    // Texturing3D Component
	    "ComposedTexture3D", "ImageTexture3D", "PixelTexture3D", "TextureCoordinate3D", "TextureCoordinate4D", "TextureTransformMatrix3D", "TextureTransform3D",
	    // Texturing component
	    "MovieTexture", "MultiTexture", "MultiTextureCoordinate", "MultiTextureTransform", "PixelTexture", "TextureCoordinateGenerator", "TextureProperties",
	    // Time component
	    "TimeSensor",
	    // Event Utilities component
	    "BooleanFilter", "BooleanSequencer", "BooleanToggle", "BooleanTrigger", "IntegerSequencer", "IntegerTrigger", "TimeTrigger",
	    // Volume rendering component
	    "BlendedVolumeStyle", "BoundaryEnhancementVolumeStyle", "CartoonVolumeStyle", "ComposedVolumeStyle", "EdgeEnhancementVolumeStyle", "IsoSurfaceVolumeData",
	    "OpacityMapVolumeStyle", "ProjectionVolumeStyle", "SegmentedVolumeData", "ShadedVolumeStyle", "SilhouetteEnhancementVolumeStyle", "ToneMappedVolumeStyle",
	    "VolumeData"
    };

    const std::string nn( mReader->getNodeName() );
    bool found = false;
    bool close_found = false;

	for(size_t i = 0; i < Uns_Skip_Len; i++)
	{
		if(nn == Uns_Skip[i])
		{
			found = true;
			if(mReader->isEmptyElement())
			{
				close_found = true;

				goto casu_cres;
			}

			while(mReader->read())
			{
				if((mReader->getNodeType() == irr::io::EXN_ELEMENT_END) && (nn == mReader->getNodeName()))
				{
					close_found = true;

					goto casu_cres;
				}
			}
		}
	}

casu_cres:

	if(!found) throw DeadlyImportError("Unknown node \"" + nn + "\" in " + pParentNodeName + ".");

	if(close_found)
		LogInfo("Skipping node \"" + nn + "\" in " + pParentNodeName + ".");
	else
		Throw_CloseNotFound(nn);
}